

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O1

void ex_random(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  float fVar1;
  float fVar2;
  int iVar3;
  t_float *ptVar4;
  t_float *ptVar5;
  uint uVar6;
  long lVar7;
  t_float *ptVar8;
  int iVar9;
  char *fmt;
  t_float tVar10;
  long lVar11;
  
  lVar7 = argv->ex_type;
  if (lVar7 - 0xeU < 2) {
    if (optr->ex_type != 0xf) {
      if (optr->ex_type == 0xe) {
LAB_0019bbd9:
        post("expr~: Int. error %d",0x3da);
        abort();
      }
      optr->ex_type = 0xf;
      ptVar8 = (t_float *)malloc((long)e->exp_vsize << 2);
      (optr->ex_cont).v_vec = ptVar8;
    }
    ptVar8 = (optr->ex_cont).v_vec;
    ptVar5 = (argv->ex_cont).v_vec;
    lVar7 = argv[1].ex_type;
    if (lVar7 - 0xeU < 2) {
      iVar9 = e->exp_vsize;
      if (iVar9 == 0) {
        return;
      }
      ptVar4 = argv[1].ex_cont.v_vec;
      lVar7 = 0;
      do {
        fVar1 = ptVar5[lVar7];
        fVar2 = ptVar4[lVar7];
        uVar6 = rand();
        ptVar8[lVar7] =
             (float)((int)((float)(uVar6 & 0x7fff) * (float)((int)fVar2 - (int)fVar1) *
                          3.0517578e-05) + (int)fVar1);
        lVar7 = lVar7 + 1;
      } while (iVar9 != (int)lVar7);
      return;
    }
    if (lVar7 == 2) {
      iVar9 = e->exp_vsize;
      if (iVar9 == 0) {
        return;
      }
      fVar1 = argv[1].ex_cont.v_flt;
      lVar7 = 0;
      do {
        fVar2 = ptVar5[lVar7];
        uVar6 = rand();
        ptVar8[lVar7] =
             (float)((int)((float)(uVar6 & 0x7fff) * (float)((int)fVar1 - (int)fVar2) *
                          3.0517578e-05) + (int)fVar2);
        lVar7 = lVar7 + 1;
      } while (iVar9 != (int)lVar7);
      return;
    }
    if (lVar7 == 1) {
      iVar9 = e->exp_vsize;
      if (iVar9 == 0) {
        return;
      }
      lVar7 = argv[1].ex_cont.v_int;
      lVar11 = 0;
      do {
        fVar1 = ptVar5[lVar11];
        uVar6 = rand();
        ptVar8[lVar11] =
             (float)((int)((float)(uVar6 & 0x7fff) * (float)((int)(float)lVar7 - (int)fVar1) *
                          3.0517578e-05) + (int)fVar1);
        lVar11 = lVar11 + 1;
      } while (iVar9 != (int)lVar11);
      return;
    }
  }
  else if (lVar7 == 2) {
    lVar7 = argv[1].ex_type;
    if (lVar7 - 0xeU < 2) {
      if (optr->ex_type != 0xf) {
        if (optr->ex_type == 0xe) goto LAB_0019bbd9;
        optr->ex_type = 0xf;
        ptVar8 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar8;
      }
      iVar9 = e->exp_vsize;
      if (iVar9 == 0) {
        return;
      }
      fVar1 = (argv->ex_cont).v_flt;
      ptVar8 = (optr->ex_cont).v_vec;
      ptVar5 = argv[1].ex_cont.v_vec;
      lVar7 = 0;
      do {
        fVar2 = ptVar5[lVar7];
        uVar6 = rand();
        ptVar8[lVar7] =
             (float)((int)((float)(uVar6 & 0x7fff) * (float)((int)fVar2 - (int)fVar1) *
                          3.0517578e-05) + (int)fVar1);
        lVar7 = lVar7 + 1;
      } while (iVar9 != (int)lVar7);
      return;
    }
    if (lVar7 == 2) {
      if (optr->ex_type == 0xf) {
        fVar1 = (argv->ex_cont).v_flt;
        ptVar8 = (optr->ex_cont).v_vec;
        fVar2 = argv[1].ex_cont.v_flt;
        uVar6 = rand();
        iVar9 = e->exp_vsize;
        if (iVar9 == 0) {
          return;
        }
        lVar7 = 0;
        do {
          ptVar8[lVar7] =
               (float)((int)((float)(uVar6 & 0x7fff) * (float)((int)fVar2 - (int)fVar1) *
                            3.0517578e-05) + (int)fVar1);
          lVar7 = lVar7 + 1;
        } while (iVar9 != (int)lVar7);
        return;
      }
      optr->ex_type = 2;
      iVar9 = (int)(argv->ex_cont).v_flt;
LAB_0019bb8a:
      tVar10 = (t_float)(int)argv[1].ex_cont.v_flt;
LAB_0019bb90:
      uVar6 = rand();
      (optr->ex_cont).v_flt =
           (float)((int)((float)(uVar6 & 0x7fff) * (float)((int)tVar10 - iVar9) * 3.0517578e-05) +
                  iVar9);
      return;
    }
    if (lVar7 == 1) {
      if (optr->ex_type == 0xf) {
        ptVar8 = (optr->ex_cont).v_vec;
        fVar1 = (argv->ex_cont).v_flt;
        tVar10 = argv[1].ex_cont.v_flt;
        uVar6 = rand();
        iVar9 = e->exp_vsize;
        if (iVar9 == 0) {
          return;
        }
        lVar7 = 0;
        do {
          ptVar8[lVar7] =
               (float)((int)((float)(uVar6 & 0x7fff) * (float)((int)tVar10 - (int)fVar1) *
                            3.0517578e-05) + (int)fVar1);
          lVar7 = lVar7 + 1;
        } while (iVar9 != (int)lVar7);
        return;
      }
      optr->ex_type = 2;
      iVar9 = (int)(argv->ex_cont).v_flt;
      tVar10 = argv[1].ex_cont.v_flt;
      goto LAB_0019bb90;
    }
  }
  else {
    if (lVar7 != 1) {
      fmt = "expr: FUNC_EVAL(%d): bad left type %ld\n";
      goto LAB_0019b7d5;
    }
    lVar7 = argv[1].ex_type;
    if (lVar7 - 0xeU < 2) {
      if (optr->ex_type != 0xf) {
        if (optr->ex_type == 0xe) goto LAB_0019bbd9;
        optr->ex_type = 0xf;
        ptVar8 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar8;
      }
      iVar9 = e->exp_vsize;
      if (iVar9 == 0) {
        return;
      }
      ptVar8 = (optr->ex_cont).v_vec;
      ptVar5 = argv[1].ex_cont.v_vec;
      lVar7 = (argv->ex_cont).v_int;
      lVar11 = 0;
      do {
        fVar1 = ptVar5[lVar11];
        uVar6 = rand();
        ptVar8[lVar11] =
             (float)((int)((float)(uVar6 & 0x7fff) * (float)((int)fVar1 - (int)(float)lVar7) *
                          3.0517578e-05) + (int)(float)lVar7);
        lVar11 = lVar11 + 1;
      } while (iVar9 != (int)lVar11);
      return;
    }
    if (lVar7 == 2) {
      if (optr->ex_type == 0xf) {
        ptVar8 = (optr->ex_cont).v_vec;
        iVar9 = *(int *)&argv->ex_cont;
        fVar1 = argv[1].ex_cont.v_flt;
        uVar6 = rand();
        iVar3 = e->exp_vsize;
        if (iVar3 == 0) {
          return;
        }
        lVar7 = 0;
        do {
          ptVar8[lVar7] =
               (float)((int)((float)(uVar6 & 0x7fff) * (float)((int)fVar1 - iVar9) * 3.0517578e-05)
                      + iVar9);
          lVar7 = lVar7 + 1;
        } while (iVar3 != (int)lVar7);
        return;
      }
      optr->ex_type = 2;
      iVar9 = *(int *)&argv->ex_cont;
      goto LAB_0019bb8a;
    }
    if (lVar7 == 1) {
      if (optr->ex_type != 0xf) {
        optr->ex_type = 1;
        iVar9 = *(int *)&argv->ex_cont;
        tVar10 = argv[1].ex_cont.v_flt;
        uVar6 = rand();
        optr->ex_cont =
             (anon_union_8_5_735de1bb_for_ex_cont)
             (long)((int)((float)(uVar6 & 0x7fff) * (float)((int)tVar10 - iVar9) * 3.0517578e-05) +
                   iVar9);
        return;
      }
      ptVar8 = (optr->ex_cont).v_vec;
      iVar9 = *(int *)&argv->ex_cont;
      tVar10 = argv[1].ex_cont.v_flt;
      uVar6 = rand();
      iVar3 = e->exp_vsize;
      if (iVar3 == 0) {
        return;
      }
      lVar7 = 0;
      do {
        ptVar8[lVar7] =
             (float)((int)((float)(uVar6 & 0x7fff) * (float)((int)tVar10 - iVar9) * 3.0517578e-05) +
                    iVar9);
        lVar7 = lVar7 + 1;
      } while (iVar3 != (int)lVar7);
      return;
    }
  }
  fmt = "expr: FUNC_EVAL(%d): bad right type %ld\n";
LAB_0019b7d5:
  pd_error(e,fmt,0x3da);
  return;
}

Assistant:

static void
ex_random(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        struct ex_ex *left, *right;
        t_float *op; /* output pointer */
        t_float *lp, *rp;         /* left and right vector pointers */
        t_float scalar;
        int j;

        left = argv++;
        right = argv;
        FUNC_EVAL(left, right, ex_dorandom, (int), (int), optr, 0);
}